

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
zmq::server_t::xattach_pipe
          (server_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  _Rb_tree_iterator<std::pair<const_unsigned_int,_zmq::server_t::outpipe_t>_> this_00;
  byte bVar1;
  pipe_t *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_zmq::server_t::outpipe_t>_>,_bool> pVar2
  ;
  bool ok;
  outpipe_t outpipe;
  uint32_t routing_id;
  outpipe_t *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  map<unsigned_int,_zmq::server_t::outpipe_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_zmq::server_t::outpipe_t>_>_>
  *in_stack_ffffffffffffffc0;
  uint32_t local_18;
  
  if (in_RSI == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/server.cpp"
            ,0x3c);
    fflush(_stderr);
    zmq_abort((char *)0x1fba10);
  }
  local_18 = *(uint32_t *)(in_RDI + 0x750);
  *(uint32_t *)(in_RDI + 0x750) = local_18 + 1;
  if (local_18 == 0) {
    local_18 = *(uint32_t *)(in_RDI + 0x750);
    *(uint32_t *)(in_RDI + 0x750) = local_18 + 1;
  }
  pipe_t::set_server_socket_routing_id(in_RSI,local_18);
  pVar2 = std::
          map<unsigned_int,zmq::server_t::outpipe_t,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,zmq::server_t::outpipe_t>>>
          ::emplace<unsigned_int&,zmq::server_t::outpipe_t&>
                    (in_stack_ffffffffffffffc0,
                     (uint *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0);
  this_00 = pVar2.first._M_node;
  bVar1 = pVar2.second;
  if (((bVar1 & 1 ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ok",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/server.cpp"
            ,0x47);
    fflush(_stderr);
    zmq_abort((char *)0x1fbafa);
  }
  fq_t::attach((fq_t *)this_00._M_node,(pipe_t *)CONCAT71(in_stack_ffffffffffffffb9,bVar1));
  return;
}

Assistant:

void zmq::server_t::xattach_pipe (pipe_t *pipe_,
                                  bool subscribe_to_all_,
                                  bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);

    uint32_t routing_id = _next_routing_id++;
    if (!routing_id)
        routing_id = _next_routing_id++; //  Never use Routing ID zero

    pipe_->set_server_socket_routing_id (routing_id);
    //  Add the record into output pipes lookup table
    outpipe_t outpipe = {pipe_, true};
    const bool ok =
      _out_pipes.ZMQ_MAP_INSERT_OR_EMPLACE (routing_id, outpipe).second;
    zmq_assert (ok);

    _fq.attach (pipe_);
}